

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content_chunked<httplib::Response>
               (Stream *strm,Response *x,ContentReceiverWithProgress *out)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  int extraout_var;
  ulong uVar4;
  unsigned_long __args_1;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int extraout_var_04;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong __args_2;
  long lVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  char *end_ptr;
  char buf [16];
  char byte;
  undefined1 local_10f0 [32];
  ulong local_10d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10c8;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  code *local_10a8;
  code *pcStack_10a0;
  anon_class_8_1_54a39818 local_1090;
  ContentReceiverWithProgress *local_1088;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1080;
  ulong local_1078;
  ulong local_1070;
  _Any_data local_1068;
  code *local_1058;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1048;
  char local_1038 [4104];
  int extraout_var_00;
  
  local_10f0._0_8_ = &local_1048;
  local_10f0._8_8_ = 0x10;
  lVar8 = 0;
  local_10f0._16_8_ = 0;
  local_10f0._24_8_ = &local_10c8;
  local_10d0 = 0;
  local_10c8._M_local_buf[0] = '\0';
  local_1090.x = x;
  local_1088 = out;
  do {
    iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
    cVar10 = local_1038[0];
    uVar1 = local_10f0._16_8_;
    if (extraout_var < 0) {
      bVar9 = false;
      bVar11 = false;
    }
    else if (CONCAT44(extraout_var,iVar3) == 0) {
      bVar11 = lVar8 != 0;
      bVar9 = false;
    }
    else {
      if ((ulong)local_10f0._16_8_ < local_10f0._8_8_ - 1) {
        local_10f0._16_8_ = local_10f0._16_8_ + 1;
        *(char *)(local_10f0._0_8_ + uVar1) = local_1038[0];
        *(char *)(local_10f0._0_8_ + local_10f0._16_8_) = '\0';
      }
      else {
        if (local_10d0 == 0) {
          if (*(char *)(local_10f0._0_8_ + local_10f0._16_8_) != '\0') goto LAB_00144e14;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_10f0 + 0x18),0,0,(char *)local_10f0._0_8_,local_10f0._16_8_);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_10f0 + 0x18),cVar10);
      }
      bVar9 = local_1038[0] != '\n';
      bVar11 = true;
    }
    lVar8 = lVar8 + -1;
  } while (bVar9);
  if (bVar11) {
    do {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_10f0 + 0x18);
      if (local_10d0 == 0) {
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10f0;
      }
      uVar4 = strtoul((*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         **)&pbVar5->_M_dataplus)->_M_local_buf,(char **)&local_1080,0x10);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_10f0 + 0x18);
      if (local_10d0 == 0) {
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10f0;
      }
      cVar10 = '\x01';
      if ((local_1080 !=
           *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)&pbVar5->_M_dataplus) && (uVar4 != 0xffffffffffffffff)) {
        if (uVar4 == 0) {
          cVar10 = '\x03';
        }
        else {
          local_10a8 = (code *)0x0;
          pcStack_10a0 = (code *)0x0;
          local_10b8 = 0;
          uStack_10b0 = 0;
          std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                    ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     &local_1068,local_1088);
          uVar6 = 0;
          do {
            __args_2 = uVar6;
            uVar6 = uVar4 - __args_2;
            if (uVar4 < __args_2 || uVar6 == 0) break;
            if (0xfff < uVar6) {
              uVar6 = 0x1000;
            }
            iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,uVar6);
            __args_1 = CONCAT44(extraout_var_00,iVar3);
            if ((__args_1 == 0 || extraout_var_00 < 0) ||
               (bVar11 = std::
                         function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
                         ::operator()((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
                                       *)&local_1068,local_1038,__args_1,__args_2,uVar4), !bVar11))
            {
              bVar11 = false;
              uVar6 = __args_2;
            }
            else {
              uVar6 = __args_1 + __args_2;
              if ((local_10a8 == (code *)0x0) ||
                 (local_1078 = uVar4, local_1070 = uVar6,
                 cVar2 = (*pcStack_10a0)(&local_10b8,&local_1070,&local_1078), cVar2 != '\0')) {
                bVar11 = true;
              }
              else {
                bVar11 = false;
              }
            }
          } while (bVar11);
          if (local_1058 != (code *)0x0) {
            (*local_1058)(&local_1068,&local_1068,__destroy_functor);
          }
          if (local_10a8 != (code *)0x0) {
            (*local_10a8)(&local_10b8,&local_10b8,3);
          }
          if (uVar4 <= __args_2) {
            local_10f0._16_8_ = 0;
            local_10d0 = 0;
            *(char *)local_10f0._24_8_ = '\0';
            lVar8 = 0;
            do {
              iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
              cVar2 = local_1038[0];
              uVar1 = local_10f0._16_8_;
              if (extraout_var_01 < 0) {
                bVar9 = false;
                bVar11 = false;
              }
              else if (CONCAT44(extraout_var_01,iVar3) == 0) {
                bVar11 = lVar8 != 0;
                bVar9 = false;
              }
              else {
                if ((ulong)local_10f0._16_8_ < local_10f0._8_8_ - 1) {
                  local_10f0._16_8_ = local_10f0._16_8_ + 1;
                  *(char *)(local_10f0._0_8_ + uVar1) = local_1038[0];
                  *(char *)(local_10f0._0_8_ + local_10f0._16_8_) = '\0';
                }
                else {
                  if (local_10d0 == 0) {
                    if (*(char *)(local_10f0._0_8_ + local_10f0._16_8_) != '\0') goto LAB_00144e14;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_10f0 + 0x18),0,0,(char *)local_10f0._0_8_,
                                 local_10f0._16_8_);
                  }
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_10f0 + 0x18),cVar2);
                }
                bVar9 = local_1038[0] != '\n';
                bVar11 = true;
              }
              uVar1 = local_10f0._24_8_;
              lVar8 = lVar8 + -1;
            } while (bVar9);
            if (bVar11) {
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_10f0._24_8_;
              if (local_10d0 == 0) {
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_10f0._0_8_;
              }
              iVar3 = strcmp(paVar7->_M_local_buf,"\r\n");
              if (iVar3 == 0) {
                local_10f0._16_8_ = 0;
                local_10d0 = 0;
                *(char *)uVar1 = '\0';
                lVar8 = 0;
                do {
                  iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
                  cVar10 = local_1038[0];
                  uVar1 = local_10f0._16_8_;
                  if (extraout_var_02 < 0) {
                    cVar10 = true;
LAB_00144b63:
                    bVar11 = false;
                  }
                  else {
                    if (CONCAT44(extraout_var_02,iVar3) == 0) {
                      cVar10 = lVar8 == 0;
                      goto LAB_00144b63;
                    }
                    if ((ulong)local_10f0._16_8_ < local_10f0._8_8_ - 1) {
                      local_10f0._16_8_ = local_10f0._16_8_ + 1;
                      *(char *)(local_10f0._0_8_ + uVar1) = local_1038[0];
                      *(char *)(local_10f0._0_8_ + local_10f0._16_8_) = '\0';
                    }
                    else {
                      if (local_10d0 == 0) {
                        if (*(char *)(local_10f0._0_8_ + local_10f0._16_8_) != '\0')
                        goto LAB_00144e14;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_10f0 + 0x18),0,0,(char *)local_10f0._0_8_,
                                   local_10f0._16_8_);
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_10f0 + 0x18),cVar10);
                    }
                    bVar11 = local_1038[0] != '\n';
                    cVar10 = false;
                  }
                  lVar8 = lVar8 + -1;
                } while (bVar11);
              }
            }
          }
        }
      }
    } while (cVar10 == '\0');
    if (cVar10 == '\x03') {
      if (uVar4 != 0) {
        __assert_fail("chunk_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                      ,0xdee,
                      "bool httplib::detail::read_content_chunked(Stream &, T &, ContentReceiverWithProgress) [T = httplib::Response]"
                     );
      }
      lVar8 = 0;
      local_10f0._16_8_ = 0;
      local_10d0 = 0;
      *(char *)local_10f0._24_8_ = '\0';
      do {
        iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
        cVar10 = local_1038[0];
        uVar1 = local_10f0._16_8_;
        if (extraout_var_03 < 0) {
          bVar11 = false;
          bVar9 = false;
        }
        else if (CONCAT44(extraout_var_03,iVar3) == 0) {
          bVar9 = lVar8 != 0;
          bVar11 = false;
        }
        else {
          if ((ulong)local_10f0._16_8_ < local_10f0._8_8_ - 1) {
            local_10f0._16_8_ = local_10f0._16_8_ + 1;
            *(char *)(local_10f0._0_8_ + uVar1) = local_1038[0];
            *(char *)(local_10f0._0_8_ + local_10f0._16_8_) = '\0';
          }
          else {
            if (local_10d0 == 0) {
              if (*(char *)(local_10f0._0_8_ + local_10f0._16_8_) != '\0') {
LAB_00144e14:
                __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                              ,0x920,"void httplib::detail::stream_line_reader::append(char)");
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_10f0 + 0x18),0,0,(char *)local_10f0._0_8_,local_10f0._16_8_);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_10f0 + 0x18),cVar10);
          }
          bVar11 = local_1038[0] != '\n';
          bVar9 = true;
        }
        lVar8 = lVar8 + -1;
      } while (bVar11);
      if (bVar9) {
        do {
          uVar4 = local_10d0;
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_10f0 + 0x18);
          if (local_10d0 == 0) {
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10f0
            ;
          }
          paVar7 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)&pbVar5->_M_dataplus;
          iVar3 = strcmp(paVar7->_M_local_buf,"\r\n");
          bVar11 = iVar3 == 0;
          if (bVar11) break;
          if (uVar4 == 0) {
            uVar4 = local_10f0._16_8_;
          }
          if (0x2000 < uVar4) break;
          parse_header<httplib::detail::read_content_chunked<httplib::Response>(httplib::Stream&,httplib::Response&,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                    (paVar7->_M_local_buf,paVar7->_M_local_buf + (uVar4 - 2),local_1090);
          local_10f0._16_8_ = 0;
          local_10d0 = 0;
          *(char *)local_10f0._24_8_ = '\0';
          lVar8 = 0;
          do {
            iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
            cVar10 = local_1038[0];
            uVar1 = local_10f0._16_8_;
            if (extraout_var_04 < 0) {
              bVar9 = false;
              bVar12 = false;
            }
            else if (CONCAT44(extraout_var_04,iVar3) == 0) {
              bVar12 = lVar8 != 0;
              bVar9 = false;
            }
            else {
              if ((ulong)local_10f0._16_8_ < local_10f0._8_8_ - 1) {
                local_10f0._16_8_ = local_10f0._16_8_ + 1;
                *(char *)(local_10f0._0_8_ + uVar1) = local_1038[0];
                *(char *)(local_10f0._0_8_ + local_10f0._16_8_) = '\0';
              }
              else {
                if (local_10d0 == 0) {
                  if (*(char *)(local_10f0._0_8_ + local_10f0._16_8_) != '\0') goto LAB_00144e14;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_10f0 + 0x18),0,0,(char *)local_10f0._0_8_,local_10f0._16_8_);
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_10f0 + 0x18),cVar10);
              }
              bVar9 = local_1038[0] != '\n';
              bVar12 = true;
            }
            lVar8 = lVar8 + -1;
          } while (bVar9);
        } while (bVar12);
        goto LAB_00144de4;
      }
    }
  }
  bVar11 = false;
LAB_00144de4:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10f0._24_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c8) {
    operator_delete((void *)local_10f0._24_8_,
                    CONCAT71(local_10c8._M_allocated_capacity._1_7_,local_10c8._M_local_buf[0]) + 1)
    ;
  }
  return bVar11;
}

Assistant:

inline bool read_content_chunked(Stream &strm, T &x,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { return false; }

    if (!line_reader.getline()) { return false; }
  }

  assert(chunk_len == 0);

  // Trailer
  if (!line_reader.getline()) { return false; }

  while (strcmp(line_reader.ptr(), "\r\n")) {
    if (line_reader.size() > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }

    // Exclude line terminator
    constexpr auto line_terminator_len = 2;
    auto end = line_reader.ptr() + line_reader.size() - line_terminator_len;

    parse_header(line_reader.ptr(), end,
                 [&](std::string &&key, std::string &&val) {
                   x.headers.emplace(std::move(key), std::move(val));
                 });

    if (!line_reader.getline()) { return false; }
  }

  return true;
}